

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7f38dd::MLDSATest_WycheproofVerifyTests87_Test::TestBody
          (MLDSATest_WycheproofVerifyTests87_Test *this)

{
  function<void_(FileTest_*)> local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object =
       MLDSAWycheproofVerifyTest<BCM_mldsa87_public_key,_4627UL,_&BCM_mldsa87_parse_public_key,_&BCM_mldsa87_verify>
  ;
  local_28._M_invoker = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("third_party/wycheproof_testvectors/mldsa_87_standard_verify_test.txt",&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

TEST(MLDSATest, WycheproofVerifyTests87) {
  FileTestGTest(
      "third_party/wycheproof_testvectors/mldsa_87_standard_verify_test.txt",
      MLDSAWycheproofVerifyTest<
          BCM_mldsa87_public_key, BCM_MLDSA87_SIGNATURE_BYTES,
          BCM_mldsa87_parse_public_key, BCM_mldsa87_verify>);
}